

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O1

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::
handle_async_shutdown
          (connection<websocketpp::config::asio_client::transport_config> *this,
          timer_ptr *shutdown_timer,shutdown_handler *callback,error_code *ec)

{
  element_type *peVar1;
  service_type *psVar2;
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_00;
  error_category *peVar3;
  bool bVar4;
  undefined3 uVar5;
  duration_type dVar6;
  error_code *__n;
  error_code eVar7;
  error_code local_40;
  time_type local_30;
  
  __n = ec;
  if ((ec->val_ != 0x7d) ||
     (__n = (error_code *)0x8fafd21e25c5e09b, ec->cat_->id_ != 0x8fafd21e25c5e09b)) {
    local_40._0_8_ =
         (((shutdown_timer->
           super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr)->impl_).implementation_.expiry.__d.__r;
    local_30.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    dVar6 = boost::asio::detail::
            chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>
            ::subtract((time_type *)&local_40,&local_30);
    if (-1 < dVar6.__r) {
      peVar1 = (shutdown_timer->
               super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      if ((peVar1->impl_).implementation_.might_have_pending_waits == true) {
        psVar2 = (peVar1->impl_).service_;
        __n = (error_code *)0xffffffffffffffff;
        boost::asio::detail::epoll_reactor::
        cancel_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,boost::asio::wait_traits<std::chrono::_V2::steady_clock>>>
                  (psVar2->scheduler_,&psVar2->timer_queue_,
                   &(peVar1->impl_).implementation_.timer_data,0xffffffffffffffff);
        (peVar1->impl_).implementation_.might_have_pending_waits = false;
      }
      local_40._0_8_ = local_40._0_8_ & 0xffffffff00000000;
      local_40._M_cat = (error_category *)std::_V2::system_category();
      if (ec->failed_ == true) {
        if ((ec->val_ != 0x6b) || (ec->cat_->id_ != 0x8fafd21e25c5e09b)) {
          eVar7 = basic_socket::connection::translate_ec<boost::system::error_code>(*ec);
          local_40._M_cat = eVar7._M_cat;
          local_40._M_value = eVar7._M_value;
          bVar4 = ec->failed_;
          uVar5 = *(undefined3 *)&ec->field_0x5;
          peVar3 = ec->cat_;
          (this->m_tec).val_ = ec->val_;
          (this->m_tec).failed_ = bVar4;
          *(undefined3 *)&(this->m_tec).field_0x5 = uVar5;
          (this->m_tec).cat_ = peVar3;
          log_err<boost::system::error_code>(this,4,"asio async_shutdown",ec);
        }
      }
      else {
        this_00 = (this->m_alog).
                  super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        if ((this_00->m_static_channels & 0x400) != 0) {
          log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                    (this_00,0x400,"asio con handle_async_shutdown",(size_t)__n);
        }
      }
      if ((callback->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*callback->_M_invoker)((_Any_data *)callback,&local_40);
        return;
      }
      std::__throw_bad_function_call();
    }
  }
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            ((this->m_alog).
             super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,0x400,"async_shutdown cancelled",(size_t)__n);
  return;
}

Assistant:

void handle_async_shutdown(timer_ptr shutdown_timer, shutdown_handler
        callback, lib::asio::error_code const & ec)
    {
        if (ec == lib::asio::error::operation_aborted ||
            lib::asio::is_neg(shutdown_timer->expires_from_now()))
        {
            m_alog->write(log::alevel::devel,"async_shutdown cancelled");
            return;
        }

        shutdown_timer->cancel();

        lib::error_code tec;
        if (ec) {
            if (ec == lib::asio::error::not_connected) {
                // The socket was already closed when we tried to close it. This
                // happens periodically (usually if a read or write fails
                // earlier and if it is a real error will be caught at another
                // level of the stack.
            } else {
                // We don't know anything more about this error, give our
                // socket/security policy a crack at it.
                tec = socket_con_type::translate_ec(ec);
                m_tec = ec;

                // all other errors are effectively pass through errors of
				// some sort so print some detail on the info channel for
				// library users to look up if needed.
				log_err(log::elevel::info,"asio async_shutdown",ec);
            }
        } else {
            if (m_alog->static_test(log::alevel::devel)) {
                m_alog->write(log::alevel::devel,
                    "asio con handle_async_shutdown");
            }
        }
        callback(tec);
    }